

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_print.c
# Opt level: O0

int fmtint(char **sbuffer,char **buffer,size_t *currlen,size_t *maxlen,int64_t value,int base,
          int min,int max,int flags)

{
  int iVar1;
  int iVar2;
  char *buffer_00;
  size_t sVar3;
  int iVar4;
  ulong in_R8;
  uint in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  uint in_stack_00000018;
  int caps;
  int zpadlen;
  int spadlen;
  int place;
  char convert [26];
  uint64_t uvalue;
  char *prefix;
  int signvalue;
  int local_9c;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff7c;
  uint uVar5;
  uint uVar6;
  int local_70;
  int local_6c;
  char acStack_68 [32];
  ulong local_48;
  char *local_40;
  int local_38;
  uint local_34;
  
  local_38 = 0;
  local_40 = "";
  local_6c = 0;
  if (in_stack_00000010 < 0) {
    in_stack_00000010 = 0;
  }
  local_48 = in_R8;
  if ((in_stack_00000018 & 0x40) == 0) {
    if ((long)in_R8 < 0) {
      local_38 = 0x2d;
      local_48 = -in_R8;
    }
    else if ((in_stack_00000018 & 2) == 0) {
      if ((in_stack_00000018 & 4) != 0) {
        local_38 = 0x20;
      }
    }
    else {
      local_38 = 0x2b;
    }
  }
  if ((in_stack_00000018 & 8) != 0) {
    if (in_R9D == 8) {
      local_40 = "0";
    }
    if (in_R9D == 0x10) {
      local_40 = "0x";
    }
  }
  uVar6 = (uint)((in_stack_00000018 & 0x20) != 0);
  iVar4 = local_6c;
  local_34 = in_R9D;
  do {
    local_6c = iVar4;
    buffer_00 = "0123456789abcdef";
    if (uVar6 != 0) {
      buffer_00 = "0123456789ABCDEF";
    }
    iVar4 = local_6c + 1;
    acStack_68[local_6c] = *(char *)((long)buffer_00 + local_48 % (ulong)local_34);
    local_48 = local_48 / local_34;
    uVar5 = in_stack_ffffffffffffff7c & 0xffffff;
    if (local_48 != 0) {
      uVar5 = CONCAT13(iVar4 < 0x1a,(int3)in_stack_ffffffffffffff7c);
    }
    in_stack_ffffffffffffff7c = uVar5;
  } while ((char)(uVar5 >> 0x18) != '\0');
  if (iVar4 == 0x1a) {
    iVar4 = local_6c;
  }
  local_6c = iVar4;
  acStack_68[local_6c] = '\0';
  local_9c = in_stack_00000010 - local_6c;
  iVar4 = local_6c;
  if (local_6c <= in_stack_00000010) {
    iVar4 = in_stack_00000010;
  }
  iVar1 = (in_stack_00000008 - iVar4) - (uint)(local_38 != 0);
  sVar3 = strlen(local_40);
  local_70 = iVar1 - (int)sVar3;
  if (local_9c < 0) {
    local_9c = 0;
  }
  if (local_70 < 0) {
    local_70 = 0;
  }
  if ((in_stack_00000018 & 0x10) != 0) {
    if (local_9c < local_70) {
      local_9c = local_70;
    }
    local_70 = 0;
  }
  if ((in_stack_00000018 & 1) != 0) {
    local_70 = -local_70;
  }
  for (; iVar2 = iVar1 >> 0x1f, 0 < local_70; local_70 = local_70 + -1) {
    iVar2 = doapr_outch((char **)CONCAT44(local_9c,uVar6),(char **)buffer_00,
                        (size_t *)CONCAT44(uVar5,in_stack_00000008),
                        (size_t *)CONCAT44(iVar4,in_stack_ffffffffffffff70),iVar2);
    if (iVar2 == 0) {
      return 0;
    }
  }
  if ((local_38 == 0) ||
     (iVar1 = doapr_outch((char **)CONCAT44(local_9c,uVar6),(char **)buffer_00,
                          (size_t *)CONCAT44(uVar5,in_stack_00000008),
                          (size_t *)CONCAT44(iVar4,in_stack_ffffffffffffff70),iVar2), iVar1 != 0)) {
    for (; *local_40 != '\0'; local_40 = local_40 + 1) {
      iVar1 = doapr_outch((char **)CONCAT44(local_9c,uVar6),(char **)buffer_00,
                          (size_t *)CONCAT44(uVar5,in_stack_00000008),
                          (size_t *)CONCAT44(iVar4,in_stack_ffffffffffffff70),iVar2);
      if (iVar1 == 0) {
        return 0;
      }
    }
    if (0 < local_9c) {
      for (; 0 < local_9c; local_9c = local_9c + -1) {
        iVar1 = doapr_outch((char **)CONCAT44(local_9c,uVar6),(char **)buffer_00,
                            (size_t *)CONCAT44(uVar5,in_stack_00000008),
                            (size_t *)CONCAT44(iVar4,in_stack_ffffffffffffff70),iVar2);
        if (iVar1 == 0) {
          return 0;
        }
      }
    }
    do {
      if (local_6c < 1) {
        while( true ) {
          if (-1 < local_70) {
            return 1;
          }
          iVar1 = doapr_outch((char **)CONCAT44(local_9c,uVar6),(char **)buffer_00,
                              (size_t *)CONCAT44(uVar5,in_stack_00000008),
                              (size_t *)CONCAT44(iVar4,in_stack_ffffffffffffff70),iVar2);
          if (iVar1 == 0) break;
          local_70 = local_70 + 1;
        }
        return 0;
      }
      local_6c = local_6c + -1;
      iVar1 = doapr_outch((char **)CONCAT44(local_9c,uVar6),(char **)buffer_00,
                          (size_t *)CONCAT44(uVar5,in_stack_00000008),
                          (size_t *)CONCAT44(iVar4,in_stack_ffffffffffffff70),iVar2);
    } while (iVar1 != 0);
  }
  return 0;
}

Assistant:

static int
fmtint(char **sbuffer,
       char **buffer,
       size_t *currlen,
       size_t *maxlen, int64_t value, int base, int min, int max, int flags)
{
    int signvalue = 0;
    const char *prefix = "";
    uint64_t uvalue;
    char convert[DECIMAL_SIZE(value) + 3];
    int place = 0;
    int spadlen = 0;
    int zpadlen = 0;
    int caps = 0;

    if (max < 0)
        max = 0;
    uvalue = value;
    if (!(flags & DP_F_UNSIGNED)) {
        if (value < 0) {
            signvalue = '-';
            uvalue = 0 - (uint64_t)value;
        } else if (flags & DP_F_PLUS)
            signvalue = '+';
        else if (flags & DP_F_SPACE)
            signvalue = ' ';
    }
    if (flags & DP_F_NUM) {
        if (base == 8)
            prefix = "0";
        if (base == 16)
            prefix = "0x";
    }
    if (flags & DP_F_UP)
        caps = 1;
    do {
        convert[place++] = (caps ? "0123456789ABCDEF" : "0123456789abcdef")
            [uvalue % (unsigned)base];
        uvalue = (uvalue / (unsigned)base);
    } while (uvalue && (place < (int)sizeof(convert)));
    if (place == sizeof(convert))
        place--;
    convert[place] = 0;

    zpadlen = max - place;
    spadlen =
        min - OSSL_MAX(max, place) - (signvalue ? 1 : 0) - strlen(prefix);
    if (zpadlen < 0)
        zpadlen = 0;
    if (spadlen < 0)
        spadlen = 0;
    if (flags & DP_F_ZERO) {
        zpadlen = OSSL_MAX(zpadlen, spadlen);
        spadlen = 0;
    }
    if (flags & DP_F_MINUS)
        spadlen = -spadlen;

    /* spaces */
    while (spadlen > 0) {
        if (!doapr_outch(sbuffer, buffer, currlen, maxlen, ' '))
            return 0;
        --spadlen;
    }

    /* sign */
    if (signvalue)
        if (!doapr_outch(sbuffer, buffer, currlen, maxlen, signvalue))
            return 0;

    /* prefix */
    while (*prefix) {
        if (!doapr_outch(sbuffer, buffer, currlen, maxlen, *prefix))
            return 0;
        prefix++;
    }

    /* zeros */
    if (zpadlen > 0) {
        while (zpadlen > 0) {
            if (!doapr_outch(sbuffer, buffer, currlen, maxlen, '0'))
                return 0;
            --zpadlen;
        }
    }
    /* digits */
    while (place > 0) {
        if (!doapr_outch(sbuffer, buffer, currlen, maxlen, convert[--place]))
            return 0;
    }

    /* left justified spaces */
    while (spadlen < 0) {
        if (!doapr_outch(sbuffer, buffer, currlen, maxlen, ' '))
            return 0;
        ++spadlen;
    }
    return 1;
}